

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfl.c
# Opt level: O2

void subtract_average_c(uint16_t *src,int16_t *dst,int width,int height,int round_offset,
                       int num_pel_log2)

{
  int iVar1;
  ulong uVar2;
  uint16_t *puVar3;
  int i;
  ulong uVar4;
  
  iVar1 = 0;
  uVar2 = (ulong)(uint)width;
  if (width < 1) {
    uVar2 = 0;
  }
  puVar3 = src;
  if (height < 1) {
    height = iVar1;
  }
  for (; iVar1 != height; iVar1 = iVar1 + 1) {
    for (uVar4 = 0; uVar2 != uVar4; uVar4 = uVar4 + 1) {
      round_offset = round_offset + (uint)puVar3[uVar4];
    }
    puVar3 = puVar3 + 0x20;
  }
  for (iVar1 = 0; iVar1 != height; iVar1 = iVar1 + 1) {
    for (uVar4 = 0; uVar2 != uVar4; uVar4 = uVar4 + 1) {
      dst[uVar4] = src[uVar4] - (short)(round_offset >> ((byte)num_pel_log2 & 0x1f));
    }
    src = src + 0x20;
    dst = dst + 0x20;
  }
  return;
}

Assistant:

static void subtract_average_c(const uint16_t *src, int16_t *dst, int width,
                               int height, int round_offset, int num_pel_log2) {
  int sum = round_offset;
  const uint16_t *recon = src;
  for (int j = 0; j < height; j++) {
    for (int i = 0; i < width; i++) {
      sum += recon[i];
    }
    recon += CFL_BUF_LINE;
  }
  const int avg = sum >> num_pel_log2;
  for (int j = 0; j < height; j++) {
    for (int i = 0; i < width; i++) {
      dst[i] = src[i] - avg;
    }
    src += CFL_BUF_LINE;
    dst += CFL_BUF_LINE;
  }
}